

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCpp.h
# Opt level: O2

void __thiscall cppforth::Forth::requireCStackDepth(Forth *this,size_t n,char *name)

{
  allocator<char> local_51;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  if ((this->controlStackIf_Begin).top < n) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,name,&local_51);
    std::operator+(&local_50,&local_30,": control stack underflow");
    throwCppExceptionMessage(this,&local_50,errorControlStackOverflow);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_30);
  }
  return;
}

Assistant:

Cell stackDepth() {
				return top ;
			}